

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_set_commands_into_script_window(Am_Object *script_window,Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Object counter;
  Am_Object cmd;
  Am_Value_List menu_commands;
  Am_Value_List cmd_list;
  
  pAVar2 = Am_Object::Get(execute_command,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&cmd_list,pAVar2);
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Adding commands ");
    poVar3 = operator<<(poVar3,&cmd_list);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = operator<<(poVar3,script_window);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  cmd.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&menu_commands);
  Am_Value_List::Start(&cmd_list);
  while( true ) {
    bVar1 = Am_Value_List::Last(&cmd_list);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&cmd_list);
    Am_Object::operator=(&cmd,pAVar2);
    am_gen_one_script_line(&counter);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&counter);
    Am_Value_List::Add(&menu_commands,pAVar4,Am_TAIL,true);
    Am_Object::~Am_Object(&counter);
    Am_Value_List::Next(&cmd_list);
  }
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"setting ");
    Am_Object::Get_Object(&counter,(Am_Slot_Key)script_window,(ulong)Am_UNDO_SCROLL_GROUP);
    poVar3 = operator<<(poVar3,&counter);
    poVar3 = std::operator<<(poVar3," value to ");
    poVar3 = operator<<(poVar3,&menu_commands);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    Am_Object::~Am_Object(&counter);
  }
  Am_Object::Get_Object(&counter,(Am_Slot_Key)script_window,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&menu_commands);
  pAVar5 = Am_Object::Set(&counter,0xa2,pAVar4,0);
  pAVar5 = Am_Object::Set(pAVar5,0x169,0,0);
  Am_Object::Set(pAVar5,0x171,0,1);
  Am_Object::~Am_Object(&counter);
  pAVar2 = Am_Object::Get(script_window,Am_EXECUTE_COUNTER,3);
  Am_Object::Am_Object(&counter,pAVar2);
  bVar1 = Am_Object::Valid(&counter);
  if (bVar1) {
    Am_Object::Set(&counter,0x169,1,0);
  }
  Am_Object::~Am_Object(&counter);
  Am_Value_List::~Am_Value_List(&menu_commands);
  Am_Object::~Am_Object(&cmd);
  Am_Value_List::~Am_Value_List(&cmd_list);
  return;
}

Assistant:

void
am_set_commands_into_script_window(Am_Object &script_window,
                                   Am_Object &execute_command)
{
  Am_Value_List cmd_list = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  if (am_sdebug)
    std::cout << "Adding commands " << cmd_list << " to " << script_window
              << std::endl
              << std::flush;
  Am_Object cmd;
  Am_Value_List menu_commands;

  for (cmd_list.Start(); !cmd_list.Last(); cmd_list.Next()) {
    cmd = cmd_list.Get();
    menu_commands.Add(am_gen_one_script_line(cmd));
  }
  if (am_sdebug)
    std::cout << "setting " << script_window.Get_Object(Am_UNDO_SCROLL_GROUP)
              << " value to " << menu_commands << std::endl
              << std::flush;
  script_window.Get_Object(Am_UNDO_SCROLL_GROUP)
      .Set(Am_ITEMS, menu_commands)
      //so nothing selected
      .Set(Am_VALUE, (0L))
      //so nothing yellow or green selected
      .Set(Am_SAVED_OLD_OBJECT_OWNER, (0L), Am_OK_IF_NOT_THERE);
  Am_Object counter =
      script_window.Get(Am_EXECUTE_COUNTER, Am_RETURN_ZERO_ON_ERROR);
  if (counter.Valid())
    counter.Set(Am_VALUE, 1);
}